

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<void*(*)(Js::RecyclableObject*,Js::CallInfo,___)>
          (BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **key,
          JavascriptFunction **value)

{
  hash_t hVar1;
  long lVar2;
  uint uVar3;
  uint depth;
  ulong uVar4;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    hVar1 = PrimePolicy::ModPrime
                      ((uint)((ulong)*key >> 4) & 0x7fffffff,*(uint *)(this + 0x1c),
                       *(int *)(this + 0x2c));
    uVar3 = *(uint *)(lVar2 + (ulong)hVar1 * 4);
    depth = 0;
    if (-1 < (int)uVar3) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      do {
        uVar4 = (ulong)uVar3;
        if (*(_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **)(lVar2 + 0x10 + uVar4 * 0x18)
            == *key) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
            lVar2 = *(long *)(this + 8);
          }
          *value = *(JavascriptFunction **)(lVar2 + uVar4 * 0x18);
          return true;
        }
        depth = depth + 1;
        uVar3 = *(uint *)(lVar2 + uVar4 * 0x18 + 8);
      } while (-1 < (int)uVar3);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }